

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

Gia_Iso2Man_t * Gia_Iso2ManStart(Gia_Man_t *pGia)

{
  int iVar1;
  uint uVar2;
  Gia_Iso2Man_t *pGVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  size_t __size;
  long lVar12;
  int iVar13;
  
  pGVar3 = (Gia_Iso2Man_t *)calloc(1,0x90);
  pGVar3->pGia = pGia;
  iVar1 = pGia->nObjs;
  lVar12 = (long)iVar1;
  pGVar3->nObjs = iVar1;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar13 = iVar1;
  }
  pVVar4->nCap = iVar13;
  if (iVar13 == 0) {
    pVVar4->pArray = (int *)0x0;
    pVVar4->nSize = iVar1;
  }
  else {
    piVar5 = (int *)malloc((long)iVar13 * 4);
    pVVar4->pArray = piVar5;
    pVVar4->nSize = iVar1;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0xff,lVar12 * 4);
    }
  }
  pGVar3->vUniques = pVVar4;
  pVVar6 = Gia_Iso2ManCollectTies(pGia);
  pGVar3->vTied = pVVar6;
  uVar11 = iVar1 - 1U;
  while( true ) {
    do {
      uVar10 = uVar11;
      uVar11 = uVar10 + 1;
    } while ((uVar10 & 1) != 0);
    if (uVar11 < 9) break;
    iVar9 = 5;
    while( true ) {
      if (uVar11 % (iVar9 - 2U) == 0) break;
      uVar2 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar11 < uVar2) goto LAB_007558f4;
    }
  }
LAB_007558f4:
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar2 = 0x10;
  if (0xe < uVar10) {
    uVar2 = uVar11;
  }
  pVVar6->nCap = uVar2;
  piVar5 = (int *)malloc((long)(int)uVar2 << 2);
  pVVar6->pArray = piVar5;
  pVVar6->nSize = uVar11;
  if (piVar5 != (int *)0x0) {
    memset(piVar5,0,(long)(int)uVar11 << 2);
  }
  pGVar3->vTable = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar6->pArray = piVar5;
  pGVar3->vPlaces = pVVar6;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(8000);
  pVVar7->pArray = ppvVar8;
  pGVar3->vSingles = pVVar7;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 10000;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(40000);
  pVVar6->pArray = piVar5;
  pGVar3->vVec0 = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 10000;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(40000);
  pVVar6->pArray = piVar5;
  pGVar3->vVec1 = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = iVar13;
  if (iVar13 == 0) {
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = iVar1;
    pGVar3->vMap0 = pVVar6;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 0;
    pVVar6->pArray = (int *)0x0;
    pVVar6->nSize = iVar1;
  }
  else {
    __size = (long)iVar13 << 2;
    piVar5 = (int *)malloc(__size);
    pVVar6->pArray = piVar5;
    pVVar6->nSize = iVar1;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0,lVar12 * 4);
    }
    pGVar3->vMap0 = pVVar6;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = iVar13;
    piVar5 = (int *)malloc(__size);
    pVVar6->pArray = piVar5;
    pVVar6->nSize = iVar1;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0,lVar12 << 2);
    }
  }
  pGVar3->vMap1 = pVVar6;
  pGVar3->nUniques = 1;
  if (0 < pVVar4->nSize) {
    *pVVar4->pArray = 0;
    return pGVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Gia_Iso2Man_t * Gia_Iso2ManStart( Gia_Man_t * pGia )
{
    Gia_Iso2Man_t * p;
    p = ABC_CALLOC( Gia_Iso2Man_t, 1 );
    p->pGia      = pGia;
    p->nObjs     = Gia_ManObjNum( pGia );
    p->nUniques  = 0;
    // internal data
    p->vUniques  = Vec_IntStartFull( p->nObjs );
    p->vTied     = Gia_Iso2ManCollectTies( pGia );
    p->vTable    = Vec_IntStart( Abc_PrimeCudd(1*p->nObjs) );
    p->vPlaces   = Vec_IntAlloc( 1000 );
    p->vSingles  = Vec_PtrAlloc( 1000 );
    p->vVec0     = Vec_IntAlloc( 10000 );
    p->vVec1     = Vec_IntAlloc( 10000 );
    p->vMap0     = Vec_IntStart( p->nObjs );
    p->vMap1     = Vec_IntStart( p->nObjs );
    // add constant 0 object
    Vec_IntWriteEntry( p->vUniques, 0, p->nUniques++ );
    return p;
}